

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_rand.c
# Opt level: O0

void * evp_rand_from_algorithm(int name_id,OSSL_ALGORITHM *algodef,OSSL_PROVIDER *prov)

{
  char *pcVar1;
  OSSL_FUNC_rand_newctx_fn *pOVar2;
  OSSL_FUNC_rand_instantiate_fn *pOVar3;
  OSSL_FUNC_rand_generate_fn *pOVar4;
  OSSL_FUNC_rand_reseed_fn *pOVar5;
  OSSL_FUNC_rand_nonce_fn *pOVar6;
  OSSL_FUNC_rand_unlock_fn *pOVar7;
  OSSL_FUNC_rand_gettable_params_fn *pOVar8;
  OSSL_FUNC_rand_get_params_fn *pOVar9;
  OSSL_FUNC_rand_get_ctx_params_fn *pOVar10;
  OSSL_FUNC_rand_set_ctx_params_fn *pOVar11;
  undefined1 *puVar12;
  long in_RDX;
  long in_RSI;
  undefined4 in_EDI;
  int fnenablelockcnt;
  int fnlockcnt;
  int fnctxcnt;
  int fnrandcnt;
  EVP_RAND *rand;
  OSSL_DISPATCH *fns;
  OSSL_PROVIDER *in_stack_ffffffffffffffb8;
  int iVar13;
  int iVar14;
  int iVar15;
  int line;
  OSSL_DISPATCH *local_28;
  long *local_8;
  
  local_28 = *(OSSL_DISPATCH **)(in_RSI + 0x10);
  line = 0;
  iVar15 = 0;
  iVar14 = 0;
  iVar13 = 0;
  local_8 = (long *)evp_rand_new();
  if (local_8 == (long *)0x0) {
    ERR_new();
    ERR_set_debug((char *)local_8,line,(char *)CONCAT44(iVar14,iVar13));
    ERR_set_error(6,0xc0100,(char *)0x0);
    local_8 = (long *)0x0;
  }
  else {
    *(undefined4 *)(local_8 + 1) = in_EDI;
    pcVar1 = ossl_algorithm_get1_first_name((OSSL_ALGORITHM *)CONCAT44(line,iVar15));
    local_8[2] = (long)pcVar1;
    if (pcVar1 == (char *)0x0) {
      evp_rand_free((void *)CONCAT44(iVar14,iVar13));
      local_8 = (long *)0x0;
    }
    else {
      local_8[3] = *(long *)(in_RSI + 0x18);
      local_8[6] = (long)local_28;
      for (; local_28->function_id != 0; local_28 = local_28 + 1) {
        in_stack_ffffffffffffffb8 = (OSSL_PROVIDER *)(ulong)(local_28->function_id - 1);
        switch(in_stack_ffffffffffffffb8) {
        case (OSSL_PROVIDER *)0x0:
          if (local_8[7] == 0) {
            pOVar2 = OSSL_FUNC_rand_newctx(local_28);
            local_8[7] = (long)pOVar2;
            iVar15 = iVar15 + 1;
          }
          break;
        case (OSSL_PROVIDER *)0x1:
          if (local_8[8] == 0) {
            puVar12 = OSSL_FUNC_rand_freectx(local_28);
            local_8[8] = (long)puVar12;
            iVar15 = iVar15 + 1;
          }
          break;
        case (OSSL_PROVIDER *)0x2:
          if (local_8[9] == 0) {
            pOVar3 = OSSL_FUNC_rand_instantiate(local_28);
            local_8[9] = (long)pOVar3;
            line = line + 1;
          }
          break;
        case (OSSL_PROVIDER *)0x3:
          if (local_8[10] == 0) {
            puVar12 = OSSL_FUNC_rand_uninstantiate(local_28);
            local_8[10] = (long)puVar12;
            line = line + 1;
          }
          break;
        case (OSSL_PROVIDER *)0x4:
          if (local_8[0xb] == 0) {
            pOVar4 = OSSL_FUNC_rand_generate(local_28);
            local_8[0xb] = (long)pOVar4;
            line = line + 1;
          }
          break;
        case (OSSL_PROVIDER *)0x5:
          if (local_8[0xc] == 0) {
            pOVar5 = OSSL_FUNC_rand_reseed(local_28);
            local_8[0xc] = (long)pOVar5;
          }
          break;
        case (OSSL_PROVIDER *)0x6:
          if (local_8[0xd] == 0) {
            pOVar6 = OSSL_FUNC_rand_nonce(local_28);
            local_8[0xd] = (long)pOVar6;
          }
          break;
        case (OSSL_PROVIDER *)0x7:
          if (local_8[0xe] == 0) {
            puVar12 = OSSL_FUNC_rand_enable_locking(local_28);
            local_8[0xe] = (long)puVar12;
            iVar13 = iVar13 + 1;
          }
          break;
        case (OSSL_PROVIDER *)0x8:
          if (local_8[0xf] == 0) {
            puVar12 = OSSL_FUNC_rand_lock(local_28);
            local_8[0xf] = (long)puVar12;
            iVar14 = iVar14 + 1;
          }
          break;
        case (OSSL_PROVIDER *)0x9:
          if (local_8[0x10] == 0) {
            pOVar7 = OSSL_FUNC_rand_unlock(local_28);
            local_8[0x10] = (long)pOVar7;
            iVar14 = iVar14 + 1;
          }
          break;
        case (OSSL_PROVIDER *)0xa:
          if (local_8[0x11] == 0) {
            pOVar8 = OSSL_FUNC_rand_gettable_params(local_28);
            local_8[0x11] = (long)pOVar8;
          }
          break;
        case (OSSL_PROVIDER *)0xb:
          if (local_8[0x12] == 0) {
            puVar12 = OSSL_FUNC_rand_gettable_ctx_params(local_28);
            local_8[0x12] = (long)puVar12;
          }
          break;
        case (OSSL_PROVIDER *)0xc:
          if (local_8[0x13] == 0) {
            puVar12 = OSSL_FUNC_rand_settable_ctx_params(local_28);
            local_8[0x13] = (long)puVar12;
          }
          break;
        case (OSSL_PROVIDER *)0xd:
          if (local_8[0x14] == 0) {
            pOVar9 = OSSL_FUNC_rand_get_params(local_28);
            local_8[0x14] = (long)pOVar9;
          }
          break;
        case (OSSL_PROVIDER *)0xe:
          if (local_8[0x15] == 0) {
            pOVar10 = OSSL_FUNC_rand_get_ctx_params(local_28);
            local_8[0x15] = (long)pOVar10;
            iVar15 = iVar15 + 1;
          }
          break;
        case (OSSL_PROVIDER *)0xf:
          if (local_8[0x16] == 0) {
            pOVar11 = OSSL_FUNC_rand_set_ctx_params(local_28);
            local_8[0x16] = (long)pOVar11;
          }
          break;
        case (OSSL_PROVIDER *)0x10:
          if (local_8[0x17] == 0) {
            puVar12 = OSSL_FUNC_rand_verify_zeroization(local_28);
            local_8[0x17] = (long)puVar12;
          }
        }
      }
      if ((((line == 3) && (iVar15 == 3)) && ((iVar13 == 0 || (iVar13 == 1)))) &&
         ((iVar14 == 0 || (iVar14 == 2)))) {
        if ((in_RDX == 0) || (iVar15 = ossl_provider_up_ref(in_stack_ffffffffffffffb8), iVar15 != 0)
           ) {
          *local_8 = in_RDX;
        }
        else {
          evp_rand_free((void *)CONCAT44(iVar14,iVar13));
          ERR_new();
          ERR_set_debug((char *)local_8,line,(char *)CONCAT44(iVar14,iVar13));
          ERR_set_error(6,0xc0103,(char *)0x0);
          local_8 = (long *)0x0;
        }
      }
      else {
        evp_rand_free((void *)CONCAT44(iVar14,iVar13));
        ERR_new();
        ERR_set_debug((char *)local_8,line,(char *)CONCAT44(iVar14,iVar13));
        ERR_set_error(6,0xc1,(char *)0x0);
        local_8 = (long *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static void *evp_rand_from_algorithm(int name_id,
                                     const OSSL_ALGORITHM *algodef,
                                     OSSL_PROVIDER *prov)
{
    const OSSL_DISPATCH *fns = algodef->implementation;
    EVP_RAND *rand = NULL;
    int fnrandcnt = 0, fnctxcnt = 0, fnlockcnt = 0, fnenablelockcnt = 0;
#ifdef FIPS_MODULE
    int fnzeroizecnt = 0;
#endif

    if ((rand = evp_rand_new()) == NULL) {
        ERR_raise(ERR_LIB_EVP, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    rand->name_id = name_id;
    if ((rand->type_name = ossl_algorithm_get1_first_name(algodef)) == NULL) {
        evp_rand_free(rand);
        return NULL;
    }
    rand->description = algodef->algorithm_description;
    rand->dispatch = fns;
    for (; fns->function_id != 0; fns++) {
        switch (fns->function_id) {
        case OSSL_FUNC_RAND_NEWCTX:
            if (rand->newctx != NULL)
                break;
            rand->newctx = OSSL_FUNC_rand_newctx(fns);
            fnctxcnt++;
            break;
        case OSSL_FUNC_RAND_FREECTX:
            if (rand->freectx != NULL)
                break;
            rand->freectx = OSSL_FUNC_rand_freectx(fns);
            fnctxcnt++;
            break;
        case OSSL_FUNC_RAND_INSTANTIATE:
            if (rand->instantiate != NULL)
                break;
            rand->instantiate = OSSL_FUNC_rand_instantiate(fns);
            fnrandcnt++;
            break;
        case OSSL_FUNC_RAND_UNINSTANTIATE:
             if (rand->uninstantiate != NULL)
                break;
            rand->uninstantiate = OSSL_FUNC_rand_uninstantiate(fns);
            fnrandcnt++;
            break;
        case OSSL_FUNC_RAND_GENERATE:
            if (rand->generate != NULL)
                break;
            rand->generate = OSSL_FUNC_rand_generate(fns);
            fnrandcnt++;
            break;
        case OSSL_FUNC_RAND_RESEED:
            if (rand->reseed != NULL)
                break;
            rand->reseed = OSSL_FUNC_rand_reseed(fns);
            break;
        case OSSL_FUNC_RAND_NONCE:
            if (rand->nonce != NULL)
                break;
            rand->nonce = OSSL_FUNC_rand_nonce(fns);
            break;
        case OSSL_FUNC_RAND_ENABLE_LOCKING:
            if (rand->enable_locking != NULL)
                break;
            rand->enable_locking = OSSL_FUNC_rand_enable_locking(fns);
            fnenablelockcnt++;
            break;
        case OSSL_FUNC_RAND_LOCK:
            if (rand->lock != NULL)
                break;
            rand->lock = OSSL_FUNC_rand_lock(fns);
            fnlockcnt++;
            break;
        case OSSL_FUNC_RAND_UNLOCK:
            if (rand->unlock != NULL)
                break;
            rand->unlock = OSSL_FUNC_rand_unlock(fns);
            fnlockcnt++;
            break;
        case OSSL_FUNC_RAND_GETTABLE_PARAMS:
            if (rand->gettable_params != NULL)
                break;
            rand->gettable_params =
                OSSL_FUNC_rand_gettable_params(fns);
            break;
        case OSSL_FUNC_RAND_GETTABLE_CTX_PARAMS:
            if (rand->gettable_ctx_params != NULL)
                break;
            rand->gettable_ctx_params =
                OSSL_FUNC_rand_gettable_ctx_params(fns);
            break;
        case OSSL_FUNC_RAND_SETTABLE_CTX_PARAMS:
            if (rand->settable_ctx_params != NULL)
                break;
            rand->settable_ctx_params =
                OSSL_FUNC_rand_settable_ctx_params(fns);
            break;
        case OSSL_FUNC_RAND_GET_PARAMS:
            if (rand->get_params != NULL)
                break;
            rand->get_params = OSSL_FUNC_rand_get_params(fns);
            break;
        case OSSL_FUNC_RAND_GET_CTX_PARAMS:
            if (rand->get_ctx_params != NULL)
                break;
            rand->get_ctx_params = OSSL_FUNC_rand_get_ctx_params(fns);
            fnctxcnt++;
            break;
        case OSSL_FUNC_RAND_SET_CTX_PARAMS:
            if (rand->set_ctx_params != NULL)
                break;
            rand->set_ctx_params = OSSL_FUNC_rand_set_ctx_params(fns);
            break;
        case OSSL_FUNC_RAND_VERIFY_ZEROIZATION:
            if (rand->verify_zeroization != NULL)
                break;
            rand->verify_zeroization = OSSL_FUNC_rand_verify_zeroization(fns);
#ifdef FIPS_MODULE
            fnzeroizecnt++;
#endif
            break;
        }
    }
    /*
     * In order to be a consistent set of functions we must have at least
     * a complete set of "rand" functions and a complete set of context
     * management functions.  In FIPS mode, we also require the zeroization
     * verification function.
     *
     * In addition, if locking can be enabled, we need a complete set of
     * locking functions.
     */
    if (fnrandcnt != 3
            || fnctxcnt != 3
            || (fnenablelockcnt != 0 && fnenablelockcnt != 1)
            || (fnlockcnt != 0 && fnlockcnt != 2)
#ifdef FIPS_MODULE
            || fnzeroizecnt != 1
#endif
       ) {
        evp_rand_free(rand);
        ERR_raise(ERR_LIB_EVP, EVP_R_INVALID_PROVIDER_FUNCTIONS);
        return NULL;
    }

    if (prov != NULL && !ossl_provider_up_ref(prov)) {
        evp_rand_free(rand);
        ERR_raise(ERR_LIB_EVP, ERR_R_INTERNAL_ERROR);
        return NULL;
    }
    rand->prov = prov;

    return rand;
}